

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::TraverseSchema::traverseComplexTypeDecl
          (TraverseSchema *this,DOMElement *elem,bool topLevel,XMLCh *recursingTypeName)

{
  XMLCh XVar1;
  XMLStringPool *pXVar2;
  SchemaGrammar *this_00;
  ComplexTypeInfo *key;
  SchemaInfo *toCheck;
  int iVar3;
  uint uVar4;
  int finalSet_00;
  XMLSize_t XVar5;
  XMLCh *pXVar6;
  undefined4 extraout_var;
  ComplexTypeInfo *pCVar7;
  XSDLocator *this_01;
  undefined4 extraout_var_00;
  XMLFileLoc lineNo;
  XMLFileLoc columnNo;
  DOMElement *pDVar8;
  undefined4 extraout_var_01;
  XSAnnotation *pXVar9;
  bool bVar10;
  bool local_13b;
  int finalSet;
  int blockSet;
  XMLCh *abstractAttVal;
  ExceptionCodes aCode;
  XMLCh *childName;
  bool isMixed;
  XMLCh *mixedVal;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  DOMElement *child;
  ComplexTypeInfo *saveTypeInfo;
  XSDLocator *local_90;
  XSDLocator *aLocator;
  XMLSize_t XStack_80;
  uint previousScope;
  XMLSize_t previousCircularCheckIndex;
  ComplexTypeInfo *pCStack_70;
  bool preProcessFlag;
  ComplexTypeInfo *typeInfo;
  XMLCh *fullName;
  int typeNameIndex;
  bool isAnonymous;
  SchemaInfo *local_48;
  XMLCh *name;
  NamespaceScopeManager nsMgr;
  XMLCh *recursingTypeName_local;
  bool topLevel_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)recursingTypeName;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&name,elem,this->fSchemaInfo,this);
  local_48 = (SchemaInfo *)getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  typeNameIndex._3_1_ = false;
  if ((local_48 == (SchemaInfo *)0x0) ||
     (XVar1._0_1_ = local_48->fAdoptInclude, XVar1._1_1_ = local_48->fProcessed, XVar1 == L'\0')) {
    if (topLevel) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0xe);
      this_local._4_4_ = -1;
      fullName._4_4_ = 1;
      goto LAB_0042f868;
    }
    bVar10 = nsMgr.fSchemaInfo == (SchemaInfo *)0x0;
    if (bVar10) {
      local_48 = (SchemaInfo *)genAnonTypeName(this,(XMLCh *)fgAnonCNamePrefix);
      typeNameIndex._3_1_ = bVar10;
    }
    else {
      local_48 = nsMgr.fSchemaInfo;
      typeNameIndex._3_1_ = bVar10;
    }
  }
  toCheck = local_48;
  XVar5 = XMLString::stringLen((XMLCh *)local_48);
  bVar10 = XMLChar1_0::isValidNCName((XMLCh *)toCheck,XVar5);
  if (bVar10) {
    XMLBuffer::set(&this->fBuffer,this->fTargetNSURIString);
    XMLBuffer::append(&this->fBuffer,L',');
    XMLBuffer::append(&this->fBuffer,(XMLCh *)local_48);
    pXVar2 = this->fStringPool;
    pXVar6 = XMLBuffer::getRawBuffer(&this->fBuffer);
    fullName._0_4_ = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar6);
    iVar3 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])();
    typeInfo = (ComplexTypeInfo *)CONCAT44(extraout_var,iVar3);
    pCStack_70 = (ComplexTypeInfo *)0x0;
    if ((((!topLevel) && (nsMgr.fSchemaInfo == (SchemaInfo *)0x0)) ||
        (pCStack_70 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                                (this->fComplexTypeRegistry,typeInfo),
        pCStack_70 == (ComplexTypeInfo *)0x0)) ||
       (bVar10 = ComplexTypeInfo::getPreprocessed(pCStack_70), bVar10)) {
      if (pCStack_70 == (ComplexTypeInfo *)0x0) {
        local_13b = false;
      }
      else {
        local_13b = ComplexTypeInfo::getPreprocessed(pCStack_70);
      }
      previousCircularCheckIndex._7_1_ = local_13b;
      if (local_13b == false) {
        GeneralAttributeCheck::checkAttributes
                  (&this->fAttributeCheck,elem,topLevel & 1 ^ 0xd,this,SUB21(topLevel & 1,0),
                   this->fNonXSAttList);
      }
      XStack_80 = this->fCircularCheckIndex;
      aLocator._4_4_ = this->fCurrentScope;
      if ((previousCircularCheckIndex._7_1_ & 1) == 0) {
        pCVar7 = (ComplexTypeInfo *)XMemory::operator_new(0xb0,this->fGrammarPoolMemoryManager);
        ComplexTypeInfo::ComplexTypeInfo(pCVar7,this->fGrammarPoolMemoryManager);
        pCStack_70 = pCVar7;
        if ((typeNameIndex._3_1_ & 1) != 0) {
          ComplexTypeInfo::setAnonymous(pCVar7);
        }
        uVar4 = this->fScopeCount;
        this->fScopeCount = uVar4 + 1;
        this->fCurrentScope = uVar4;
        RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::put
                  (this->fComplexTypeRegistry,typeInfo,pCStack_70);
        ComplexTypeInfo::setTypeName(pCStack_70,(XMLCh *)typeInfo);
        ComplexTypeInfo::setScopeDefined(pCStack_70,this->fCurrentScope);
        if ((this->fFullConstraintChecking & 1U) != 0) {
          this_01 = (XSDLocator *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          XSDLocator::XSDLocator(this_01);
          pXVar2 = this->fStringPool;
          local_90 = this_01;
          pXVar6 = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
          uVar4 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar6);
          iVar3 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar4);
          lineNo = XSDElementNSImpl::getLineNo((XSDElementNSImpl *)elem);
          columnNo = XSDElementNSImpl::getColumnNo((XSDElementNSImpl *)elem);
          XSDLocator::setValues
                    (this_01,(XMLCh *)CONCAT44(extraout_var_00,iVar3),(XMLCh *)0x0,lineNo,columnNo);
          ComplexTypeInfo::setLocator(pCStack_70,local_90);
        }
      }
      else {
        uVar4 = ComplexTypeInfo::getScopeDefined(pCStack_70);
        this->fCurrentScope = uVar4;
        ComplexTypeInfo::setPreprocessed(pCStack_70,false);
      }
      saveTypeInfo._4_4_ = (int)fullName;
      ValueVectorOf<unsigned_int>::addElement
                (this->fCurrentTypeNameStack,(uint *)((long)&saveTypeInfo + 4));
      pCVar7 = this->fCurrentComplexType;
      this->fCurrentComplexType = pCStack_70;
      pDVar8 = XUtil::getFirstChildElement(&elem->super_DOMNode);
      janAnnot.fData =
           (XSAnnotation *)
           checkContent(this,elem,pDVar8,true,(bool)(~previousCircularCheckIndex._7_1_ & 1));
      bVar10 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
      if (((bVar10) && (this->fAnnotation == (XSAnnotation *)0x0)) &&
         (XVar5 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar5 != 0)) {
        pXVar9 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
        this->fAnnotation = pXVar9;
      }
      Janitor<xercesc_4_0::XSAnnotation>::Janitor
                ((Janitor<xercesc_4_0::XSAnnotation> *)&mixedVal,this->fAnnotation);
      pXVar6 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_MIXED,Boolean);
      childName._7_1_ = false;
      if (((pXVar6 != (XMLCh *)0x0) && (*pXVar6 != L'\0')) &&
         ((bVar10 = XMLString::equals((XMLCh *)SchemaSymbols::fgATTVAL_TRUE,pXVar6), bVar10 ||
          (bVar10 = XMLString::equals(L"1",pXVar6), bVar10)))) {
        childName._7_1_ = true;
      }
      if (janAnnot.fData == (XSAnnotation *)0x0) {
        processComplexContent
                  (this,elem,(XMLCh *)local_48,(DOMElement *)0x0,pCStack_70,(XMLCh *)0x0,
                   childName._7_1_,false);
      }
      else {
        iVar3 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x18])();
        bVar10 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar3),
                                   (XMLCh *)SchemaSymbols::fgELT_SIMPLECONTENT);
        if (bVar10) {
          traverseSimpleContentDecl
                    (this,(XMLCh *)local_48,(XMLCh *)typeInfo,(DOMElement *)janAnnot.fData,
                     pCStack_70,(Janitor<xercesc_4_0::XSAnnotation> *)&mixedVal);
          pDVar8 = XUtil::getNextSiblingElement((DOMNode *)janAnnot.fData);
          if (pDVar8 != (DOMElement *)0x0) {
            reportSchemaError(this,(DOMElement *)janAnnot.fData,(XMLCh *)XMLUni::fgXMLErrDomain,0x2d
                             );
          }
        }
        else {
          bVar10 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar3),
                                     (XMLCh *)SchemaSymbols::fgELT_COMPLEXCONTENT);
          if (bVar10) {
            traverseComplexContentDecl
                      (this,(XMLCh *)local_48,(DOMElement *)janAnnot.fData,pCStack_70,
                       childName._7_1_,(Janitor<xercesc_4_0::XSAnnotation> *)&mixedVal);
            pDVar8 = XUtil::getNextSiblingElement((DOMNode *)janAnnot.fData);
            if (pDVar8 != (DOMElement *)0x0) {
              reportSchemaError(this,(DOMElement *)janAnnot.fData,(XMLCh *)XMLUni::fgXMLErrDomain,
                                0x2e);
            }
          }
          else if (this->fCurrentGroupInfo == (XercesGroupInfo *)0x0) {
            processComplexContent
                      (this,elem,(XMLCh *)local_48,(DOMElement *)janAnnot.fData,pCStack_70,
                       (XMLCh *)0x0,childName._7_1_,false);
          }
          else {
            ComplexTypeInfo::setPreprocessed(pCStack_70,true);
          }
        }
      }
      if ((previousCircularCheckIndex._7_1_ & 1) == 0) {
        pXVar6 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_ABSTRACT,Boolean);
        iVar3 = parseBlockSet(this,elem,1,false);
        finalSet_00 = parseFinalSet(this,elem,3,false);
        ComplexTypeInfo::setBlockSet(pCStack_70,iVar3);
        ComplexTypeInfo::setFinalSet(pCStack_70,finalSet_00);
        if (((pXVar6 == (XMLCh *)0x0) || (*pXVar6 == L'\0')) ||
           ((bVar10 = XMLString::equals(pXVar6,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE), !bVar10 &&
            (bVar10 = XMLString::equals(pXVar6,L"1"), !bVar10)))) {
          ComplexTypeInfo::setAbstract(pCStack_70,false);
        }
        else {
          ComplexTypeInfo::setAbstract(pCStack_70,true);
        }
      }
      bVar10 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull
                         ((Janitor<xercesc_4_0::XSAnnotation> *)&mixedVal);
      key = pCStack_70;
      if (!bVar10) {
        this_00 = this->fSchemaGrammar;
        pXVar9 = Janitor<xercesc_4_0::XSAnnotation>::release
                           ((Janitor<xercesc_4_0::XSAnnotation> *)&mixedVal);
        SchemaGrammar::putAnnotation(this_00,key,pXVar9);
      }
      popCurrentTypeNameStack(this);
      this->fCircularCheckIndex = XStack_80;
      this->fCurrentScope = aLocator._4_4_;
      this->fCurrentComplexType = pCVar7;
      this_local._4_4_ = (int)fullName;
      fullName._4_4_ = 1;
      Janitor<xercesc_4_0::XSAnnotation>::~Janitor((Janitor<xercesc_4_0::XSAnnotation> *)&mixedVal);
    }
    else {
      this_local._4_4_ = (int)fullName;
      fullName._4_4_ = 1;
    }
  }
  else {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                      (XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE,(XMLCh *)local_48,(XMLCh *)0x0,
                      (XMLCh *)0x0);
    this_local._4_4_ = -1;
    fullName._4_4_ = 1;
  }
LAB_0042f868:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&name);
  return this_local._4_4_;
}

Assistant:

int TraverseSchema::traverseComplexTypeDecl(const DOMElement* const elem,
                                            const bool topLevel,
                                            const XMLCh* const recursingTypeName) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // Get the attributes of the complexType
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    bool isAnonymous = false;

    if (!name || !*name) {

        if (topLevel) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameComplexType);
            return -1;
        }

        if (recursingTypeName)
            name = recursingTypeName;
        else {
            name = genAnonTypeName(fgAnonCNamePrefix);
            isAnonymous = true;
        }
    }

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name)) ) {

        //REVISIT - Should we return or continue and save type with wrong name?
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_COMPLEXTYPE, name);
        return -1;
    }

    // ------------------------------------------------------------------
    // Check if the type has already been registered
    // ------------------------------------------------------------------
    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(name);

    int typeNameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* fullName = fStringPool->getValueForId(typeNameIndex);
    ComplexTypeInfo* typeInfo = 0;

    if (topLevel || recursingTypeName) {

        typeInfo = fComplexTypeRegistry->get(fullName);

        if (typeInfo && !typeInfo->getPreprocessed()) {
            return typeNameIndex;
        }
    }

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    bool preProcessFlag = (typeInfo) ? typeInfo->getPreprocessed() : false;
    if (!preProcessFlag) {
        fAttributeCheck.checkAttributes(
            elem, (topLevel) ? GeneralAttributeCheck::E_ComplexTypeGlobal
                             : GeneralAttributeCheck::E_ComplexTypeLocal
            , this, topLevel, fNonXSAttList
        );
    }

    // -----------------------------------------------------------------------
    // Create a new instance
    // -----------------------------------------------------------------------
    XMLSize_t previousCircularCheckIndex = fCircularCheckIndex;
    unsigned int previousScope = fCurrentScope;

    if (preProcessFlag) {

        fCurrentScope = typeInfo->getScopeDefined();
        typeInfo->setPreprocessed(false);
    }
    else {

        // ------------------------------------------------------------------
        // Register the type
        // ------------------------------------------------------------------
        typeInfo = new (fGrammarPoolMemoryManager) ComplexTypeInfo(fGrammarPoolMemoryManager);
        if(isAnonymous) {
            typeInfo->setAnonymous();
        }

        fCurrentScope = fScopeCount++;
        fComplexTypeRegistry->put((void*) fullName, typeInfo);
        typeInfo->setTypeName(fullName);
        typeInfo->setScopeDefined(fCurrentScope);

        if (fFullConstraintChecking) {

            XSDLocator* aLocator = new (fGrammarPoolMemoryManager) XSDLocator();
            aLocator->setValues(fStringPool->getValueForId(fStringPool->addOrFind(fSchemaInfo->getCurrentSchemaURL())),
                                0, ((XSDElementNSImpl*) elem)->getLineNo(),
                                ((XSDElementNSImpl*) elem)->getColumnNo());
            typeInfo->setLocator(aLocator);
        }
    }

    fCurrentTypeNameStack->addElement(typeNameIndex);
    ComplexTypeInfo* saveTypeInfo = fCurrentComplexType;
    fCurrentComplexType = typeInfo;

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration and get next child
    // ------------------------------------------------------------------
    DOMElement* child = checkContent(elem, XUtil::getFirstChildElement(elem), true, !preProcessFlag);

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Process the content of the complex type declaration
    // ------------------------------------------------------------------
    try {

        const XMLCh* mixedVal = getElementAttValue(elem,SchemaSymbols::fgATT_MIXED, DatatypeValidator::Boolean);
        bool isMixed = false;

        if ((mixedVal && *mixedVal)
            && (XMLString::equals(SchemaSymbols::fgATTVAL_TRUE, mixedVal)
                || XMLString::equals(fgValueOne, mixedVal))) {
            isMixed = true;
        }

        if (child == 0) {
            // EMPTY complexType with complexContent
            processComplexContent(elem, name, child, typeInfo, 0, isMixed);
        }
        else {

            const XMLCh* childName = child->getLocalName();

            if (XMLString::equals(childName, SchemaSymbols::fgELT_SIMPLECONTENT)) {

                // SIMPLE CONTENT element
                traverseSimpleContentDecl(name, fullName, child, typeInfo, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingSimpleContent);
                }
            }
            else if (XMLString::equals(childName, SchemaSymbols::fgELT_COMPLEXCONTENT)) {

                // COMPLEX CONTENT element
                traverseComplexContentDecl(name, child, typeInfo, isMixed, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingConplexContent);
                }
            }
            else if (fCurrentGroupInfo) {
                typeInfo->setPreprocessed(true);
            }
            else {
                // We must have ....
                // GROUP, ALL, SEQUENCE or CHOICE, followed by optional attributes
                // Note that it's possible that only attributes are specified.
                processComplexContent(elem, name, child, typeInfo, 0, isMixed);
            }
        }
    }
    catch(const TraverseSchema::ExceptionCodes aCode) {
        if (aCode == TraverseSchema::InvalidComplexTypeInfo)
            defaultComplexTypeInfo(typeInfo);
        else if (aCode == TraverseSchema::RecursingElement)
            typeInfo->setPreprocessed();
    }

    // ------------------------------------------------------------------
    // Finish the setup of the typeInfo
    // ------------------------------------------------------------------
    if (!preProcessFlag) {

        const XMLCh* abstractAttVal = getElementAttValue(elem, SchemaSymbols::fgATT_ABSTRACT, DatatypeValidator::Boolean);
        int blockSet = parseBlockSet(elem, C_Block);
        int finalSet = parseFinalSet(elem, EC_Final);

        typeInfo->setBlockSet(blockSet);
        typeInfo->setFinalSet(finalSet);

        if ((abstractAttVal && *abstractAttVal)
            && (XMLString::equals(abstractAttVal, SchemaSymbols::fgATTVAL_TRUE)
                || XMLString::equals(abstractAttVal, fgValueOne))) {
            typeInfo->setAbstract(true);
        }
        else {
            typeInfo->setAbstract(false);
        }
    }

    // Store Annotation
    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(typeInfo, janAnnot.release());

    // ------------------------------------------------------------------
    // Before exiting, restore the scope, mainly for nested anonymous types
    // ------------------------------------------------------------------
    popCurrentTypeNameStack();
    fCircularCheckIndex = previousCircularCheckIndex;
    fCurrentScope = previousScope;
    fCurrentComplexType = saveTypeInfo;

    return typeNameIndex;
}